

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O1

void __thiscall SuffixTest_Cast_Test::TestBody(SuffixTest_Cast_Test *this)

{
  SuffixBase SVar1;
  bool bVar2;
  SuffixImpl *pSVar3;
  undefined4 *puVar4;
  char *pcVar5;
  StringRef name;
  AssertionResult gtest_ar;
  IntSuffix is;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  SuffixTable local_38;
  SuffixBase local_18;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  name.size_ = 1;
  name.data_ = "a";
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  pSVar3 = mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
                     (&(this->super_SuffixTest).suffixes_,name,0,1,&local_38);
  puVar4 = (undefined4 *)operator_new(4);
  *puVar4 = 0;
  (pSVar3->field_3).values = puVar4;
  local_18.impl_ = pSVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  SVar1.impl_ = local_18.impl_;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(SuffixImpl *)0x0;
  if (((local_18.impl_)->kind & 4) == 0) {
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18.impl_;
  }
  testing::internal::CmpHelperEQ<mp::BasicSuffix<int>,mp::BasicSuffix<int>>
            ((internal *)&local_38,"is","mp::Cast<mp::IntSuffix>(s)",(BasicSuffix<int> *)&local_18,
             (BasicSuffix<int> *)&local_48);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",
               0xe9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((SuffixImpl *)local_48.ptr_ != (SuffixImpl *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((SuffixImpl *)local_48.ptr_ != (SuffixImpl *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40.data_ = (AssertHelperData *)SVar1.impl_;
  if (((SVar1.impl_)->kind & 4) == 0) {
    local_40.data_ = (AssertHelperData *)(SuffixImpl *)0x0;
  }
  testing::internal::CmpHelperEQ<mp::Suffix,mp::BasicSuffix<double>>
            ((internal *)&local_38,"Suffix()","mp::Cast<mp::DoubleSuffix>(s)",(Suffix *)&local_48,
             (BasicSuffix<double> *)&local_40);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",
               0xea,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SuffixTest, Cast) {
  mp::IntSuffix is = suffixes_.Add<int>("a", 0, 1);
  Suffix s = is;
  EXPECT_EQ(is, mp::Cast<mp::IntSuffix>(s));
  EXPECT_EQ(Suffix(), mp::Cast<mp::DoubleSuffix>(s));
}